

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_write_short_Test::TestBody
          (ByteBufferTest_test_read_write_short_Test *this)

{
  long *plVar1;
  bool bVar2;
  undefined2 uVar3;
  char *pcVar4;
  int16_t short2;
  int16_t short1;
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  AssertHelper local_90;
  short local_84 [2];
  Message local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  local_84[1] = 0x236;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)local_38);
  uVar3 = bidfx_public_api::tools::ByteBuffer::ReadShort();
  local_80.ss_.ptr_._0_1_ = SUB21(uVar3,0);
  local_80.ss_.ptr_._1_1_ = (undefined1)((ushort)uVar3 >> 8);
  testing::internal::CmpHelperEQ<short,short>
            (local_68,"short1","byte_buffer1.ReadShort()",local_84 + 1,(short *)&local_80);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message(&local_80);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x97,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (CONCAT62(local_80.ss_.ptr_._2_6_,CONCAT11(local_80.ss_.ptr_._1_1_,local_80.ss_.ptr_._0_1_))
        != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (plVar1 = (long *)CONCAT62(local_80.ss_.ptr_._2_6_,
                                    CONCAT11(local_80.ss_.ptr_._1_1_,local_80.ss_.ptr_._0_1_)),
         plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_84[0] = -0x1b1;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,2);
  bidfx_public_api::tools::ByteBuffer::WriteShort((short)local_68);
  local_90.data_._0_2_ = bidfx_public_api::tools::ByteBuffer::ReadShort();
  testing::internal::CmpHelperEQ<short,short>
            ((internal *)&local_80,"short2","byte_buffer2.ReadShort()",local_84,(short *)&local_90);
  if (local_80.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x9c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (CONCAT62(local_90.data_._2_6_,local_90.data_._0_2_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT62(local_90.data_._2_6_,local_90.data_._0_2_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT62(local_90.data_._2_6_,local_90.data_._0_2_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_write_short)
{
    int16_t short1 = 566;
    ByteBuffer byte_buffer1(2);
    byte_buffer1.WriteShort(short1);
    EXPECT_EQ(short1, byte_buffer1.ReadShort());

    int16_t short2 = -433;
    ByteBuffer byte_buffer2(2);
    byte_buffer2.WriteShort(short2);
    EXPECT_EQ(short2, byte_buffer2.ReadShort());
}